

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

Id __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::createCompositeConstruct
          (TGlslangToSpvTraverser *this,Id resultTypeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *constituents)

{
  Op OVar1;
  pointer puVar2;
  pointer ppIVar3;
  Instruction *pIVar4;
  Id IVar5;
  uint uVar6;
  Id IVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  Builder *pBVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rTypeConstituents;
  Id local_a4;
  Id local_a0;
  Id local_9c;
  TGlslangToSpvTraverser *local_98;
  Id local_8c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  Builder *local_80;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pBVar11 = &this->builder;
  lVar10 = 0;
  local_a0 = resultTypeId;
  local_98 = this;
  local_88 = constituents;
  local_80 = pBVar11;
  do {
    puVar2 = (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(constituents->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar2) >> 2) <= lVar10) {
      IVar5 = spv::Builder::createCompositeConstruct(pBVar11,resultTypeId,constituents);
      return IVar5;
    }
    IVar5 = spv::Builder::getContainedTypeId(pBVar11,resultTypeId,(int)lVar10);
    ppIVar3 = (local_98->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar4 = ppIVar3[puVar2[lVar10]];
    if (pIVar4 == (Instruction *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = (ulong)pIVar4->typeId;
    }
    IVar7 = (Id)uVar8;
    if (IVar5 != IVar7) {
      if ((local_98->glslangIntermediate->spvVersion).spv < 0x10400) {
        OVar1 = ppIVar3[uVar8]->opCode;
        local_9c = IVar5;
        if (OVar1 == OpTypeArray) {
          local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uVar6 = spv::Builder::getNumTypeConstituents(pBVar11,IVar7);
          IVar5 = spv::Builder::getContainedTypeId(pBVar11,IVar7);
          uVar9 = 0;
          if ((int)uVar6 < 1) {
            uVar6 = 0;
            uVar9 = 0;
          }
          for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
            local_a4 = spv::Builder::createCompositeExtract(pBVar11,puVar2[lVar10],IVar5,uVar9);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,&local_a4);
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
          IVar5 = createCompositeConstruct
                            (local_98,local_9c,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60);
          constituents = local_88;
          (local_88->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar10] = IVar5;
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
          resultTypeId = local_a0;
        }
        else {
          if (OVar1 != OpTypeStruct) {
            __assert_fail("builder.isArrayType(rType)",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                          ,0xb5d,
                          "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createCompositeConstruct(spv::Id, std::vector<spv::Id>)"
                         );
          }
          local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_8c = IVar7;
          uVar6 = spv::Builder::getNumTypeConstituents(pBVar11,IVar7);
          uVar9 = 0;
          if ((int)uVar6 < 1) {
            uVar6 = 0;
            uVar9 = 0;
          }
          for (; pBVar11 = local_80, uVar6 != uVar9; uVar9 = uVar9 + 1) {
            IVar5 = puVar2[lVar10];
            IVar7 = spv::Builder::getContainedTypeId(local_80,local_8c,uVar9);
            local_a4 = spv::Builder::createCompositeExtract(pBVar11,IVar5,IVar7,uVar9);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,&local_a4);
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
          IVar5 = createCompositeConstruct
                            (local_98,local_9c,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
          constituents = local_88;
          (local_88->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar10] = IVar5;
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
          pBVar11 = local_80;
          resultTypeId = local_a0;
        }
      }
      else {
        IVar5 = spv::Builder::createUnaryOp(pBVar11,OpCopyLogical,IVar5,puVar2[lVar10]);
        puVar2[lVar10] = IVar5;
      }
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

spv::Id TGlslangToSpvTraverser::createCompositeConstruct(spv::Id resultTypeId, std::vector<spv::Id> constituents)
{
    for (int c = 0; c < (int)constituents.size(); ++c) {
        spv::Id& constituent = constituents[c];
        spv::Id lType = builder.getContainedTypeId(resultTypeId, c);
        spv::Id rType = builder.getTypeId(constituent);
        if (lType != rType) {
            if (glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_4) {
                constituent = builder.createUnaryOp(spv::OpCopyLogical, lType, constituent);
            } else if (builder.isStructType(rType)) {
                std::vector<spv::Id> rTypeConstituents;
                int numrTypeConstituents = builder.getNumTypeConstituents(rType);
                for (int i = 0; i < numrTypeConstituents; ++i) {
                    rTypeConstituents.push_back(builder.createCompositeExtract(constituent,
                        builder.getContainedTypeId(rType, i), i));
                }
                constituents[c] = createCompositeConstruct(lType, rTypeConstituents);
            } else {
                assert(builder.isArrayType(rType));
                std::vector<spv::Id> rTypeConstituents;
                int numrTypeConstituents = builder.getNumTypeConstituents(rType);

                spv::Id elementRType = builder.getContainedTypeId(rType);
                for (int i = 0; i < numrTypeConstituents; ++i) {
                    rTypeConstituents.push_back(builder.createCompositeExtract(constituent, elementRType, i));
                }
                constituents[c] = createCompositeConstruct(lType, rTypeConstituents);
            }
        }
    }
    return builder.createCompositeConstruct(resultTypeId, constituents);
}